

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5Tokenize(Fts5Config *pConfig,int flags,char *pText,int nText,void *pCtx,
                       _func_int_void_ptr_int_char_ptr_int_int_int *xToken)

{
  undefined4 in_ECX;
  long in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  Fts5Config *in_stack_00000010;
  int rc;
  undefined4 local_34;
  
  local_34 = 0;
  if (in_RDX != 0) {
    if (*(long *)(in_RDI + 0x80) == 0) {
      local_34 = sqlite3Fts5LoadTokenizer(in_stack_00000010);
    }
    if (local_34 == 0) {
      if (*(long *)(in_RDI + 0x90) == 0) {
        local_34 = (**(code **)(*(long *)(in_RDI + 0x88) + 0x18))
                             (*(undefined8 *)(in_RDI + 0x80),in_R8,in_ESI,in_RDX,in_ECX,
                              *(undefined8 *)(in_RDI + 0xa8),*(undefined4 *)(in_RDI + 0xb0),in_R9);
      }
      else {
        local_34 = (**(code **)(*(long *)(in_RDI + 0x90) + 0x10))
                             (*(undefined8 *)(in_RDI + 0x80),in_R8,in_ESI,in_RDX,in_ECX,in_R9);
      }
    }
  }
  return local_34;
}

Assistant:

static int sqlite3Fts5Tokenize(
  Fts5Config *pConfig,            /* FTS5 Configuration object */
  int flags,                      /* FTS5_TOKENIZE_* flags */
  const char *pText, int nText,   /* Text to tokenize */
  void *pCtx,                     /* Context passed to xToken() */
  int (*xToken)(void*, int, const char*, int, int, int)    /* Callback */
){
  int rc = SQLITE_OK;
  if( pText ){
    if( pConfig->t.pTok==0 ){
      rc = sqlite3Fts5LoadTokenizer(pConfig);
    }
    if( rc==SQLITE_OK ){
      if( pConfig->t.pApi1 ){
        rc = pConfig->t.pApi1->xTokenize(
            pConfig->t.pTok, pCtx, flags, pText, nText, xToken
        );
      }else{
        rc = pConfig->t.pApi2->xTokenize(pConfig->t.pTok, pCtx, flags,
            pText, nText, pConfig->t.pLocale, pConfig->t.nLocale, xToken
        );
      }
    }
  }
  return rc;
}